

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource_private.hh
# Opt level: O0

qpdf_offset_t __thiscall InputSource::fastTell(InputSource *this)

{
  int iVar1;
  undefined4 extraout_var;
  qpdf_offset_t curr;
  InputSource *this_local;
  long lVar2;
  
  if (this->buf_len == 0) {
    loadBuffer(this);
  }
  else {
    iVar1 = (*this->_vptr_InputSource[4])();
    lVar2 = CONCAT44(extraout_var,iVar1);
    if ((lVar2 < this->buf_start) || (this->buf_start + this->buf_len <= lVar2)) {
      loadBuffer(this);
    }
    else {
      this->last_offset = lVar2;
      this->buf_idx = lVar2 - this->buf_start;
    }
  }
  return this->last_offset;
}

Assistant:

inline qpdf_offset_t
InputSource::fastTell()
{
    if (buf_len == 0) {
        loadBuffer();
    } else {
        auto curr = tell();
        if (curr < buf_start || curr >= (buf_start + buf_len)) {
            loadBuffer();
        } else {
            last_offset = curr;
            buf_idx = curr - buf_start;
        }
    }
    return last_offset;
}